

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsLogoProfTrack(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Sector *pSVar7;
  Track *__range1;
  Sector *s;
  pointer this;
  
  iVar4 = Track::size(track);
  if ((iVar4 == 10) || (iVar4 = Track::size(track), iVar4 == 0xb)) {
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this != pSVar1) {
      iVar4 = 2;
      do {
        iVar5 = Track::size(track);
        iVar6 = (this->header).sector;
        if ((iVar5 == 0xb) && (iVar6 == 1)) {
          bVar2 = Sector::has_badidcrc(this);
          cVar3 = bVar2 * '\x02' + '\x01';
        }
        else {
          cVar3 = '\x01';
          if ((this->datarate == _250K) &&
             (((this->encoding == MFM &&
               (iVar5 = iVar4 + 1, bVar2 = iVar6 == iVar4, iVar4 = iVar5, bVar2)) &&
              (iVar6 = Sector::size(this), iVar6 == 0x200)))) {
            bVar2 = Sector::has_good_data(this);
            cVar3 = !bVar2;
          }
        }
        if ((cVar3 != '\x03') && (cVar3 != '\0')) goto LAB_0016e756;
        this = this + 1;
      } while (this != pSVar1);
    }
    iVar4 = Track::size(track);
    if (iVar4 == 10) {
      iVar4 = Sector::SizeCodeToLength(1);
      iVar6 = GetSectorOverhead(MFM);
      pSVar7 = Track::operator[](track,0);
      if (pSVar7->offset < (iVar6 + iVar4) * 0x10) {
        return false;
      }
    }
    bVar2 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [31])"detected Logo Professor track\n");
    }
  }
  else {
LAB_0016e756:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsLogoProfTrack(const Track& track)
{
    // Accept track with or without placeholder sector
    if (track.size() != 10 && track.size() != 11)
        return false;

    // First non-placeholder sector id.
    int id = 2;

    for (auto& s : track)
    {
        // Check for placeholder sector, present in old EDSK images.
        if (track.size() == 11 && s.header.sector == 1)
        {
            // It must have a bad ID header CRC.
            if (s.has_badidcrc())
                continue;
            else
                return false;
        }

        // Ensure each sector is double-density MFM, 512-bytes, with good data
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != id++ || s.size() != 512 || !s.has_good_data())
            return false;
    }

    // If there's no placeholder, the first sector must begin late
    if (track.size() == 10)
    {
        // Determine an offset considered late
        auto min_offset = Sector::SizeCodeToLength(1) + GetSectorOverhead(Encoding::MFM);

        // Reject if first sector doesn't start late on the track
        if (track[0].offset < (min_offset * 16))
            return false;
    }

    if (opt.debug) util::cout << "detected Logo Professor track\n";
    return true;
}